

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_util.h
# Opt level: O2

void GetLine(FILE *file,string *str_line)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  ostream *poVar5;
  scoped_array<char> *this;
  allocator local_66;
  allocator local_65;
  undefined1 local_64 [4];
  scoped_array<char> line;
  string local_58;
  string local_38;
  
  if (file == (FILE *)0x0) {
    line.array_._0_4_ = 2;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,(allocator *)local_64);
    std::__cxx11::string::string((string *)&local_58,"GetLine",&local_66);
    poVar5 = Logger::Start(ERR,&local_38,0xad,&local_58);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xad);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"file");
    std::operator<<(poVar5," == NULL \n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    this = &line;
  }
  else {
    pcVar2 = (char *)operator_new__(0xa00000);
    line.array_ = pcVar2;
    pcVar3 = fgets(pcVar2,0xa00000,(FILE *)file);
    if (pcVar3 != (char *)0x0) {
      sVar4 = strlen(pcVar2);
      iVar1 = (int)sVar4;
      pcVar2 = scoped_array<char>::operator[](&line,(long)(iVar1 + -1));
      if (*pcVar2 == '\n') {
        pcVar2 = scoped_array<char>::operator[](&line,(long)(iVar1 + -1));
        *pcVar2 = '\0';
        if (1 < iVar1) {
          pcVar2 = scoped_array<char>::operator[](&line,(ulong)(iVar1 - 2));
          if (*pcVar2 == '\r') {
            pcVar2 = scoped_array<char>::operator[](&line,(ulong)(iVar1 - 2));
            *pcVar2 = '\0';
          }
        }
      }
      else {
        local_64 = (undefined1  [4])0x3;
        std::__cxx11::string::string
                  ((string *)&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                   ,&local_66);
        std::__cxx11::string::string((string *)&local_58,"GetLine",&local_65);
        poVar5 = Logger::Start(FATAL,&local_38,0xb2,&local_58);
        std::operator<<(poVar5,
                        "Encountered a too-long line:                   Cannot find the \'\\n\' char.                     Please check the data."
                       );
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_38);
        Logger::~Logger((Logger *)local_64);
      }
      std::__cxx11::string::assign((char *)str_line);
      scoped_array<char>::~scoped_array(&line);
      return;
    }
    local_64 = (undefined1  [4])0x2;
    std::__cxx11::string::string
              ((string *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
               ,&local_66);
    std::__cxx11::string::string((string *)&local_58,"GetLine",&local_65);
    poVar5 = Logger::Start(ERR,&local_38,0xaf,&local_58);
    poVar5 = std::operator<<(poVar5,"CHECK failed ");
    poVar5 = std::operator<<(poVar5,
                             "/workspace/llm4binary/github/license_c_cmakelists/aksnzhy[P]xlearn/src/base/file_util.h"
                            );
    poVar5 = std::operator<<(poVar5,":");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,0xaf);
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"fgets(line.get(), kMaxLineSize, file)");
    std::operator<<(poVar5," == NULL \n");
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_38);
    this = (scoped_array<char> *)local_64;
  }
  Logger::~Logger((Logger *)this);
  abort();
}

Assistant:

inline void GetLine(FILE *file, std::string &str_line) {
  CHECK_NOTNULL(file);
  scoped_array<char> line(new char[kMaxLineSize]);
  CHECK_NOTNULL(fgets(line.get(), kMaxLineSize, file));
  int read_len = strlen(line.get());
  if (line[read_len-1] != '\n') {
    LOG(FATAL) << "Encountered a too-long line: \
                  Cannot find the '\\n' char.   \
                  Please check the data.";
  } else {
    line[read_len-1] = '\0';
    // Handle the format in DOS and Windows
    if (read_len > 1 && line[read_len-2] == '\r') {
      line[read_len-2] = '\0';
    }
  }
  str_line.assign(line.get());
}